

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
ArrayToVectorState<true,_float>::Uint
          (ArrayToVectorState<true,_float> *this,Context<true> *param_2,uint f)

{
  BaseState<true> *in_RDI;
  value_type_conflict3 *in_stack_ffffffffffffffd8;
  
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_RDI,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& /* ctx */, unsigned f)
  {
    output_array->push_back((T)f);
    return this;
  }